

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpMessage<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  byte *pbVar2;
  bool bVar3;
  ushort uVar4;
  uint32_t has_idx;
  char *pcVar5;
  MessageLite *pMVar6;
  string *psVar7;
  TcParseTableBase *table_00;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  Arena *arena;
  char *pcVar12;
  FieldEntry *pFVar13;
  long *plVar14;
  int iVar15;
  FieldEntry *entry;
  long lVar16;
  int iVar17;
  pair<const_char_*,_int> pVar18;
  int local_40;
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  pFVar13 = entry;
  if (((ulong)entry & 3) != 0) {
LAB_001577fe:
    AlignFail(pFVar13);
  }
  uVar1 = entry->type_card;
  uVar4 = uVar1 & 0x30;
  if (uVar4 == 0x20) {
    if ((uVar1 & 0x1c0) == 0x40) {
      pcVar5 = MpRepeatedMessageOrGroup<false,true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
    if ((uVar1 & 0x1c0) == 0) {
      pcVar5 = MpRepeatedMessageOrGroup<false,false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
LAB_001575ab:
    pcVar5 = (*table->fallback)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar5;
  }
  uVar11 = data.field_0._0_4_ & 7;
  if ((uVar1 & 0x1c0) == 0x40) {
    if (uVar11 != 3) goto LAB_001575ab;
  }
  else if (((uVar1 & 0x1c0) != 0) || (uVar11 != 2)) goto LAB_001575ab;
  if (uVar4 == 0x30) {
    bVar3 = ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,
                        (ParseContext *)data.field_0,msg);
  }
  else {
    if (uVar4 == 0x10) {
      pbVar2 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
      *pbVar2 = *pbVar2 | '\x01' << (entry->has_idx & 7U);
    }
    bVar3 = false;
  }
  if ((ulong)table->has_bits_offset != 0) {
    pFVar13 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)pFVar13 & 3) != 0) goto LAB_001577fe;
    pFVar13->offset = pFVar13->offset | (uint)hasbits;
  }
  plVar14 = (long *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset + (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  uVar4 = uVar1 >> 9 & 3;
  if (uVar4 != 2) {
    if ((uVar1 >> 9 & 3) == 0) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      pcVar5 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
      uVar8 = 0x40;
      uVar9 = 0x902;
      goto LAB_001578cb;
    }
    if (uVar4 != 1) {
      table_00 = *(TcParseTableBase **)table_00;
    }
    table_00 = MessageLite::GetTcParseTable((MessageLite *)table_00);
  }
  if ((bVar3 | *plVar14 == 0) == 1) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(table_00->class_data,arena);
    *plVar14 = (long)pMVar6;
  }
  if ((uVar1 & 0x1c0) == 0x40) {
    iVar10 = ctx->depth_;
    uVar11 = iVar10 - 1;
    ctx->depth_ = uVar11;
    if (0 < iVar10) {
      iVar17 = ctx->group_depth_;
      iVar15 = (int)((long)iVar17 + 1);
      ctx->group_depth_ = iVar15;
      pcVar5 = ParseLoopPreserveNone((MessageLite *)*plVar14,ptr,ctx,table_00);
      if (pcVar5 == (char *)0x0) {
        iVar17 = ctx->group_depth_ + -1;
        iVar10 = ctx->depth_ + 1;
LAB_001577d2:
        ctx->group_depth_ = iVar17;
        ctx->depth_ = iVar10;
        uVar11 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar11 == data.field_0._0_4_) {
          return pcVar5;
        }
        return (char *)0x0;
      }
      if (uVar11 == ctx->depth_) {
        if (iVar15 == ctx->group_depth_) goto LAB_001577d2;
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)iVar17 + 1,(long)ctx->group_depth_,
                            "old_group_depth == group_depth_");
        pcVar5 = *(char **)psVar7;
        uVar8 = *(undefined8 *)(psVar7 + 8);
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
        ;
        uVar9 = 0x45c;
      }
      else {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)uVar11,(long)ctx->depth_,"old_depth == depth_");
        pcVar5 = *(char **)psVar7;
        uVar8 = *(undefined8 *)(psVar7 + 8);
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
        ;
        uVar9 = 0x45b;
      }
LAB_001578cb:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0,pcVar12,uVar9,uVar8,pcVar5);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0);
    }
  }
  else {
    if (*ptr < '\0') {
      pVar18 = ReadSizeFallback(ptr,(uint)(byte)*ptr);
      pcVar5 = pVar18.first;
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      pcVar5 = ptr + 1;
    }
    if (0 < ctx->depth_) {
      EpsCopyInputStream::PushLimit
                ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)pcVar5);
      lVar16 = (long)ctx->depth_ + -1;
      iVar17 = (int)lVar16;
      ctx->depth_ = iVar17;
      pcVar5 = ParseLoopPreserveNone((MessageLite *)*plVar14,pcVar5,ctx,table_00);
      iVar10 = ctx->depth_;
      if ((pcVar5 != (char *)0x0) && (iVar17 != iVar10)) {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar16,(long)iVar10,"old_depth == depth_");
        pcVar5 = *(char **)psVar7;
        uVar8 = *(undefined8 *)(psVar7 + 8);
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
        ;
        uVar9 = 1099;
        goto LAB_001578cb;
      }
      ctx->depth_ = iVar10 + 1;
      uVar11 = local_40 + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar11;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar11 >> 0x1f & uVar11);
        return pcVar5;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}